

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Header6::Encode(Header6 *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Header6 *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8ProtocolVersion);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8ExerciseID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8PDUType);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8ProtocolFamily);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_TimeStamp).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16PDULength);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Padding1);
  KDataStream::operator<<(pKVar1,this->m_ui8Padding2);
  return;
}

Assistant:

void Header6::Encode( KDataStream & stream ) const
{
    stream << m_ui8ProtocolVersion
           << m_ui8ExerciseID
           << m_ui8PDUType
           << m_ui8ProtocolFamily
           << KDIS_STREAM m_TimeStamp
           << m_ui16PDULength
           << m_ui8Padding1
           << m_ui8Padding2;
}